

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::RecordSet::operator==(RecordSet *this,RecordSet *Value)

{
  bool bVar1;
  RecordSet *Value_local;
  RecordSet *this_local;
  
  if (this->m_ui32RecID == Value->m_ui32RecID) {
    if (this->m_ui32RecSetSerialNum == Value->m_ui32RecSetSerialNum) {
      if (this->m_ui16RecLen == Value->m_ui16RecLen) {
        if (this->m_ui16RecCnt == Value->m_ui16RecCnt) {
          bVar1 = std::operator!=(&this->m_vui8RecVals,&Value->m_vui8RecVals);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL RecordSet::operator == ( const RecordSet & Value ) const
{
    if( m_ui32RecID           != Value.m_ui32RecID )            return false;
    if( m_ui32RecSetSerialNum != Value.m_ui32RecSetSerialNum )  return false;
    if( m_ui16RecLen          != Value.m_ui16RecLen )           return false;
    if( m_ui16RecCnt          != Value.m_ui16RecCnt )           return false;
    if( m_vui8RecVals         != Value.m_vui8RecVals )          return false;
    return true;
}